

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleCameraNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer *pppaVar1;
  iterator __position;
  pointer ppaVar2;
  ai_uint32 aVar3;
  aiCamera *paVar4;
  aiNode *this_00;
  size_t sVar5;
  char *__s;
  aiCamera *camera;
  aiCamera *local_30;
  
  paVar4 = (aiCamera *)operator_new(0x438);
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  (paVar4->mPosition).x = 0.0;
  (paVar4->mPosition).y = 0.0;
  *(undefined8 *)&(paVar4->mPosition).z = 0;
  (paVar4->mUp).y = 1.0;
  (paVar4->mUp).z = 0.0;
  (paVar4->mLookAt).x = 0.0;
  (paVar4->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar4->mLookAt).z = 0x3f490fdb3f800000;
  paVar4->mClipPlaneNear = 0.1;
  paVar4->mClipPlaneFar = 1000.0;
  paVar4->mAspect = 0.0;
  __position._M_current =
       (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = paVar4;
  if (__position._M_current ==
      (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*const&>
              ((vector<aiCamera*,std::allocator<aiCamera*>> *)&this->m_cameraCache,__position,
               &local_30);
  }
  else {
    *__position._M_current = paVar4;
    pppaVar1 = &(this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  this->m_currentCamera = local_30;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pushNode(this,this_00,pScene);
  this->m_tokenType = 6;
  this->m_currentNode = this_00;
  handleNodes(this,node,pScene);
  ppaVar2 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppaVar2) {
    (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar2 + -1;
  }
  __s = (this_00->mName).data;
  sVar5 = strlen(__s);
  aVar3 = (ai_uint32)sVar5;
  if ((int)aVar3 < 0x400) {
    paVar4 = this->m_currentCamera;
    (paVar4->mName).length = aVar3;
    memcpy((paVar4->mName).data,__s,(long)(int)aVar3);
    (paVar4->mName).data[(int)aVar3] = '\0';
  }
  return;
}

Assistant:

void OpenGEXImporter::handleCameraNode( DDLNode *node, aiScene *pScene ) {
    aiCamera *camera( new aiCamera );
    m_cameraCache.push_back( camera );
    m_currentCamera = camera;

    aiNode *newNode = new aiNode;
    pushNode( newNode, pScene );
    m_tokenType = Grammar::CameraNodeToken;
    m_currentNode = newNode;

    handleNodes( node, pScene );

    popNode();

    m_currentCamera->mName.Set( newNode->mName.C_Str() );
}